

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_visuals.cxx
# Opt level: O2

void __thiscall
xray_re::xr_level_visuals::load
          (xr_level_visuals *this,uint32_t xrlc_version,xr_reader *r,xr_level_geom *geom)

{
  xr_reader *local_20;
  
  local_20 = xr_reader::open_chunk(r,(xrlc_version < 8) + 3);
  if (local_20 != (xr_reader *)0x0) {
    load_ogfs(this,local_20,geom);
    xr_reader::close_chunk(r,&local_20);
    return;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_visuals.cxx"
                ,0x54,
                "void xray_re::xr_level_visuals::load(uint32_t, xr_reader &, const xr_level_geom *)"
               );
}

Assistant:

void xr_level_visuals::load(uint32_t xrlc_version, xr_reader& r, const xr_level_geom* geom)
{
	xr_reader* s = 0;

	if (xrlc_version < XRLC_VERSION_8)
		s = r.open_chunk(FSL5_VISUALS);
	else
		s = r.open_chunk(FSL8_VISUALS);

	xr_assert(s);
	load_ogfs(*s, geom);
	r.close_chunk(s);
}